

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cpp
# Opt level: O1

void __thiscall icu_63::StringPiece::StringPiece(StringPiece *this,StringPiece *x,int32_t pos)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  
  iVar1 = x->length_;
  iVar2 = pos;
  if (iVar1 < pos) {
    iVar2 = iVar1;
  }
  iVar3 = 0;
  if (-1 < pos) {
    iVar3 = iVar2;
  }
  this->ptr_ = x->ptr_ + iVar3;
  this->length_ = iVar1 - iVar3;
  return;
}

Assistant:

StringPiece::StringPiece(const StringPiece& x, int32_t pos) {
  if (pos < 0) {
    pos = 0;
  } else if (pos > x.length_) {
    pos = x.length_;
  }
  ptr_ = x.ptr_ + pos;
  length_ = x.length_ - pos;
}